

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O0

void convert(vector<const_char_*,_std::allocator<const_char_*>_> *in,
            vector<const_char_*,_std::allocator<const_char_*>_> *views,char *outname,bool override)

{
  PixelType PVar1;
  char *pcVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  invalid_argument *piVar7;
  reference ppcVar8;
  Header *pHVar9;
  reference pvVar10;
  string *psVar11;
  reference pvVar12;
  string *psVar13;
  Channel *pCVar14;
  reference pvVar15;
  reference pvVar16;
  reference pvVar17;
  byte in_CL;
  char *in_RDX;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RDI;
  OutputPart outpart;
  size_t i_3;
  InputPart inpart;
  MultiPartOutputFile outfile;
  size_t samplesize;
  Header *h_2;
  ConstIterator chan;
  int part;
  size_t i_2;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  channelstore;
  int64_t pixel_base;
  int64_t pixel_width;
  int64_t pixel_count;
  Box2i dataWindow;
  ConstIterator i_1;
  int channel_count;
  ChannelList *in_chanlist;
  bool pforce;
  int pnum;
  string pname;
  string fn;
  Header *h_1;
  int i;
  FrameBuffer input_framebuffer;
  vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> output_framebuffers;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> output_headers;
  int parts;
  vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
  output_channels;
  StringVector h;
  string hero;
  vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
  input_channels;
  MultiPartInputFile infile;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  allocator_type *in_stack_fffffffffffffb40;
  size_type in_stack_fffffffffffffb48;
  ulong uVar18;
  vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *in_stack_fffffffffffffb50;
  vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
  *in_stack_fffffffffffffb78;
  Slice *pSVar19;
  vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
  *in_stack_fffffffffffffb80;
  int *in_stack_fffffffffffffbc8;
  bool *in_stack_fffffffffffffbd0;
  string *in_stack_fffffffffffffbd8;
  string *in_stack_fffffffffffffbe0;
  undefined1 local_308 [24];
  MultiPartOutputFile local_2f0 [16];
  Slice local_2e0 [8];
  vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
  *in_stack_fffffffffffffd28;
  MultiPartInputFile *in_stack_fffffffffffffd30;
  Slice local_2a8 [56];
  ulong local_270;
  reference local_268;
  undefined8 local_260;
  int local_254;
  ulong local_250;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  local_240;
  long local_228;
  int local_220;
  long local_218;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *in_stack_fffffffffffffe00;
  int local_1f8;
  int local_1f4;
  byte local_195;
  string local_190 [32];
  string local_170 [32];
  Header *local_150;
  int local_144;
  string *in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffecf;
  __normal_iterator<Imf_3_4::MultiViewChannelName_*,_std::vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>_>
  *in_stack_fffffffffffffed0;
  __normal_iterator<Imf_3_4::MultiViewChannelName_*,_std::vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>_>
  *in_stack_fffffffffffffed8;
  vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> local_108;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> local_e8;
  MultiViewChannelName *local_d0;
  MultiViewChannelName *local_c8;
  int local_bc;
  vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_> local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  string local_88 [32];
  vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_> local_68;
  MultiPartInputFile local_50 [55];
  byte local_19;
  char *local_18;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  sVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(in_RDI);
  if (sVar6 != 1) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar7,"can only convert one file at once - use \'combine\' mode for multiple files")
    ;
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  ppcVar8 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](in_RDI,0);
  pcVar2 = *ppcVar8;
  iVar5 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(local_50,pcVar2,iVar5,true);
  iVar5 = Imf_3_4::MultiPartInputFile::parts();
  if (iVar5 == 1) {
    std::vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>::
    vector((vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_> *)
           0x108921);
    std::__cxx11::string::string(local_88);
    pHVar9 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_50);
    bVar3 = Imf_3_4::hasMultiView(pHVar9);
    if ((bVar3 & 1) != 0) {
      pHVar9 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_50);
      Imf_3_4::multiView_abi_cxx11_(pHVar9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb80,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb78);
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_a0);
      if (sVar6 != 0) {
        pvVar10 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&local_a0,0);
        std::__cxx11::string::operator=(local_88,(string *)pvVar10);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb40);
    }
    Imf_3_4::
    GetChannelsInMultiPartFile<std::vector<Imf_3_4::MultiViewChannelName,std::allocator<Imf_3_4::MultiViewChannelName>>>
              (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    std::vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>::
    vector(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    local_c8 = (MultiViewChannelName *)
               std::
               vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
               ::begin((vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
                        *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    local_d0 = (MultiViewChannelName *)
               std::
               vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
               ::end((vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
                      *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    local_bc = Imf_3_4::
               SplitChannels<__gnu_cxx::__normal_iterator<Imf_3_4::MultiViewChannelName*,std::vector<Imf_3_4::MultiViewChannelName,std::allocator<Imf_3_4::MultiViewChannelName>>>>
                         (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                          (bool)in_stack_fffffffffffffecf,in_stack_fffffffffffffec0);
    std::allocator<Imf_3_4::Header>::allocator((allocator<Imf_3_4::Header> *)0x108af6);
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
               (allocator_type *)in_stack_fffffffffffffb40);
    std::allocator<Imf_3_4::Header>::~allocator((allocator<Imf_3_4::Header> *)0x108b22);
    std::allocator<Imf_3_4::FrameBuffer>::allocator((allocator<Imf_3_4::FrameBuffer> *)0x108b47);
    std::vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>::vector
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
               (allocator_type *)in_stack_fffffffffffffb40);
    std::allocator<Imf_3_4::FrameBuffer>::~allocator((allocator<Imf_3_4::FrameBuffer> *)0x108b73);
    Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x108b80);
    for (local_144 = 0; local_144 < local_bc; local_144 = local_144 + 1) {
      local_150 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                            (&local_e8,(long)local_144);
      pHVar9 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_50);
      Imf_3_4::Header::operator=(local_150,pHVar9);
      bVar3 = Imf_3_4::hasMultiView(local_150);
      if ((bVar3 & 1) != 0) {
        Imf_3_4::Header::erase((char *)local_150);
      }
      std::__cxx11::string::string(local_170);
      std::__cxx11::string::string(local_190);
      parse_filename(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                     in_stack_fffffffffffffbc8);
      bVar3 = Imf_3_4::Header::hasName();
      if (((bVar3 & 1) == 0) || ((local_195 & 1) != 0)) {
        Imf_3_4::Header::setName((string *)local_150);
      }
      Imf_3_4::ChannelList::ChannelList((ChannelList *)0x108d80);
      Imf_3_4::Header::channels();
      Imf_3_4::ChannelList::operator=
                ((ChannelList *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 (ChannelList *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
      Imf_3_4::ChannelList::~ChannelList((ChannelList *)0x108db9);
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::~string(local_170);
    }
    make_unique_names(in_stack_fffffffffffffe00);
    Imf_3_4::MultiPartInputFile::header((int)local_50);
    psVar11 = (string *)Imf_3_4::Header::channels();
    Imf_3_4::ChannelList::begin();
    while( true ) {
      Imf_3_4::ChannelList::end();
      bVar4 = Imf_3_4::operator!=((ConstIterator *)
                                  CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                                  (ConstIterator *)
                                  CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
      if (!bVar4) break;
      Imf_3_4::ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
    }
    Imf_3_4::MultiPartInputFile::header((int)local_50);
    Imf_3_4::Header::dataWindow();
    Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
              ((Box<Imath_3_2::Vec2<int>_> *)
               CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               (Box<Imath_3_2::Vec2<int>_> *)
               CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size
              ((Box<Imath_3_2::Vec2<int>_> *)
               CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size
              ((Box<Imath_3_2::Vec2<int>_> *)
               CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size
              ((Box<Imath_3_2::Vec2<int>_> *)
               CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    local_218 = (long)local_220 + 1;
    local_228 = local_1f4 * local_218 + (long)local_1f8;
    std::allocator<std::vector<char,_std::allocator<char>_>_>::allocator
              ((allocator<std::vector<char,_std::allocator<char>_>_> *)0x10903b);
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
    std::allocator<std::vector<char,_std::allocator<char>_>_>::~allocator
              ((allocator<std::vector<char,_std::allocator<char>_>_> *)0x109067);
    for (local_250 = 0; uVar18 = local_250,
        sVar6 = std::
                vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
                ::size(&local_68), uVar18 < sVar6; local_250 = local_250 + 1) {
      pvVar12 = std::
                vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
                ::operator[](&local_b8,local_250);
      local_254 = pvVar12->part_number;
      psVar13 = psVar11;
      std::vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>::
      operator[](&local_68,local_250);
      local_260 = Imf_3_4::ChannelList::find(psVar13);
      local_268 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                            (&local_e8,(long)local_254);
      psVar13 = (string *)Imf_3_4::Header::channels();
      pvVar12 = std::
                vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
                ::operator[](&local_b8,local_250);
      Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x109174);
      Imf_3_4::ChannelList::insert(psVar13,(Channel *)pvVar12);
      std::vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>::
      operator[](&local_b8,local_250);
      bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                              (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
      ;
      pvVar17 = local_268;
      if (bVar4) {
        std::vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>::
        operator[](&local_b8,local_250);
        Imf_3_4::Header::setView((string *)pvVar17);
      }
      local_270 = 4;
      pCVar14 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x109270);
      if (*(int *)pCVar14 == 1) {
        local_270 = 2;
      }
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::operator[](&local_240,local_250);
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffb50,
                 in_stack_fffffffffffffb48);
      psVar13 = (string *)
                std::vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>::operator[]
                          (&local_108,(long)local_254);
      pvVar12 = std::
                vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
                ::operator[](&local_b8,local_250);
      pCVar14 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x109307);
      PVar1 = *(PixelType *)pCVar14;
      pvVar15 = std::
                vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                ::operator[](&local_240,local_250);
      pvVar16 = std::vector<char,_std::allocator<char>_>::operator[](pvVar15,0);
      Imf_3_4::Slice::Slice
                (local_2a8,PVar1,pvVar16 + -(local_228 * local_270),local_270,local_218 * local_270,
                 1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert(psVar13,(Slice *)pvVar12);
      pvVar12 = std::
                vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
                ::operator[](&local_68,local_250);
      pSVar19 = (Slice *)&pvVar12->internal_name;
      pCVar14 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x1093d7);
      PVar1 = *(PixelType *)pCVar14;
      pvVar15 = std::
                vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                ::operator[](&local_240,local_250);
      pvVar16 = std::vector<char,_std::allocator<char>_>::operator[](pvVar15,0);
      in_stack_fffffffffffffb30 = 0;
      in_stack_fffffffffffffb28 = 1;
      Imf_3_4::Slice::Slice
                (local_2e0,PVar1,pvVar16 + -(local_228 * local_270),local_270,local_218 * local_270,
                 1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((string *)&stack0xfffffffffffffec0,pSVar19);
    }
    pvVar17 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                        (&local_e8,0);
    sVar6 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size(&local_e8);
    iVar5 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
              (local_2f0,local_18,pvVar17,(int)sVar6,false,iVar5);
    Imf_3_4::InputPart::InputPart((InputPart *)(local_308 + 0x10),local_50,0);
    Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)(local_308 + 0x10));
    Imf_3_4::InputPart::readPixels((int)local_308 + 0x10,local_1f4);
    local_308._8_8_ = 0;
    while (uVar18 = local_308._8_8_,
          sVar6 = std::vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>::size
                            (&local_108), uVar18 < sVar6) {
      Imf_3_4::OutputPart::OutputPart((OutputPart *)local_308,local_2f0,local_308._8_4_);
      std::vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>::operator[]
                (&local_108,local_308._8_8_);
      Imf_3_4::OutputPart::setFrameBuffer((FrameBuffer *)local_308);
      Imf_3_4::OutputPart::writePixels((int)local_308);
      local_308._8_8_ = local_308._8_8_ + 1;
    }
    Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(local_2f0);
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::~vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffb40);
    Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x10964f);
    std::vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>::~vector
              ((vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *)
               in_stack_fffffffffffffb40);
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               in_stack_fffffffffffffb40);
    std::vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>::
    ~vector((vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_> *
            )in_stack_fffffffffffffb40);
    std::__cxx11::string::~string(local_88);
    std::vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>::
    ~vector((vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_> *
            )in_stack_fffffffffffffb40);
    Imf_3_4::MultiPartInputFile::~MultiPartInputFile
              ((MultiPartInputFile *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
    return;
  }
  piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (piVar7,
             "can only convert single part EXRs to multipart EXR-2.0 files: use \'split\' mode instead"
            );
  __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
convert (
    vector<const char*> in,
    vector<const char*> views,
    const char*         outname,
    bool                override)
{
    if (in.size () != 1)
        throw invalid_argument (
            "can only convert one file at once - use 'combine' mode for multiple files");

    MultiPartInputFile infile (in[0]);

    if (infile.parts () != 1)
        throw invalid_argument (
            "can only convert single part EXRs to multipart EXR-2.0 files: use 'split' mode instead");

    vector<MultiViewChannelName> input_channels;

    string hero;
    if (hasMultiView (infile.header (0)))
    {
        StringVector h = multiView (infile.header (0));
        if (h.size () > 0) { hero = h[0]; }
    }

    // retrieve channel names from input file in view-friendly format
    GetChannelsInMultiPartFile (infile, input_channels);

    vector<MultiViewChannelName> output_channels = input_channels;
    // remap channels to multiple output parts
    int parts = SplitChannels (
        output_channels.begin (), output_channels.end (), true, hero);

    vector<Header>      output_headers (parts);
    vector<FrameBuffer> output_framebuffers (parts);
    FrameBuffer         input_framebuffer;

    //
    // make all output headers the same as the input header but
    // with no channels
    //
    for (int i = 0; i < parts; i++)
    {
        Header& h = output_headers[i];
        h         = infile.header (0);
        if (hasMultiView (h)) h.erase ("multiView");

        string fn, pname;
        int    pnum;
        bool   pforce;
        parse_filename (fn, pname, pforce, pnum);
        if (!h.hasName () || pforce) h.setName (pname);

        h.channels () = ChannelList ();
    }

    make_unique_names (output_headers);

    const ChannelList& in_chanlist = infile.header (0).channels ();

    int channel_count = 0;
    for (ChannelList::ConstIterator i = in_chanlist.begin ();
         i != in_chanlist.end ();
         ++i)
    {
        ++channel_count;
    }

    Box2i dataWindow  = infile.header (0).dataWindow ();
    //
    // use int64_t for dimensions, since possible overflow int storage
    //
    int64_t pixel_count = (static_cast<int64_t>(dataWindow.size ().y) + 1) * (static_cast<int64_t>(dataWindow.size ().x) + 1);
    int64_t pixel_width = static_cast<int64_t>(dataWindow.size ().x) + 1;

    //
    // offset in pixels between base of array and 0,0
    // use int64_t for dimensions, since dataWindow.min.y * pixel_width could overflow int storage
    //
    int64_t pixel_base = static_cast<int64_t>(dataWindow.min.y) * pixel_width + static_cast<int64_t>(dataWindow.min.x);

    vector<vector<char>> channelstore (channel_count);

    //
    // insert channels into correct header and framebuffers
    //
    for (size_t i = 0; i < input_channels.size (); i++)
    {
        // read the part we should be writing channel into, insert into header
        int                        part = output_channels[i].part_number;
        ChannelList::ConstIterator chan =
            in_chanlist.find (input_channels[i].internal_name);
        Header& h = output_headers[part];
        h.channels ().insert (output_channels[i].name, chan.channel ());

        if (output_channels[i].view != "")
        {
            h.setView (output_channels[i].view);
        }

        // compute size of channel
        size_t samplesize = sizeof (float);
        if (chan.channel ().type == HALF) { samplesize = sizeof (half); }
        channelstore[i].resize (samplesize * pixel_count);

        output_framebuffers[part].insert (
            output_channels[i].name,
            Slice (
                chan.channel ().type,
                &channelstore[i][0] - pixel_base * samplesize,
                samplesize,
                pixel_width * samplesize));

        input_framebuffer.insert (
            input_channels[i].internal_name,
            Slice (
                chan.channel ().type,
                &channelstore[i][0] - pixel_base * samplesize,
                samplesize,
                pixel_width * samplesize));
    }

    //
    // create output file
    //
    MultiPartOutputFile outfile (
        outname, &output_headers[0], output_headers.size ());

    InputPart inpart (infile, 0);

    //
    // read file
    //
    inpart.setFrameBuffer (input_framebuffer);
    inpart.readPixels (dataWindow.min.y, dataWindow.max.y);

    //
    // write each part
    //

    for (size_t i = 0; i < output_framebuffers.size (); i++)
    {
        OutputPart outpart (outfile, i);
        outpart.setFrameBuffer (output_framebuffers[i]);
        outpart.writePixels (dataWindow.max.y + 1 - dataWindow.min.y);
    }
}